

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRuntimeDependencyArchive.cxx
# Opt level: O0

bool __thiscall cmRuntimeDependencyArchive::Prepare(cmRuntimeDependencyArchive *this)

{
  bool bVar1;
  int iVar2;
  cmMakefile *pcVar3;
  string *psVar4;
  ulong uVar5;
  ostream *poVar6;
  pointer pcVar7;
  string local_280;
  undefined1 local_260 [8];
  ostringstream e;
  unique_ptr<cmBinUtilsMacOSMachOLinker,_std::default_delete<cmBinUtilsMacOSMachOLinker>_> local_e0;
  cmRuntimeDependencyArchive *local_d8;
  unique_ptr<cmBinUtilsWindowsPELinker,_std::default_delete<cmBinUtilsWindowsPELinker>_> local_d0;
  cmRuntimeDependencyArchive *local_c8;
  unique_ptr<cmBinUtilsLinuxELFLinker,_std::default_delete<cmBinUtilsLinuxELFLinker>_> local_c0;
  allocator<char> local_b1;
  string local_b0;
  undefined1 local_90 [8];
  string systemName;
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [8];
  string platform;
  cmRuntimeDependencyArchive *this_local;
  
  platform.field_2._8_8_ = this;
  pcVar3 = GetMakefile(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"CMAKE_GET_RUNTIME_DEPENDENCIES_PLATFORM",&local_59);
  psVar4 = cmMakefile::GetSafeDefinition(pcVar3,&local_58);
  std::__cxx11::string::string((string *)local_38,(string *)psVar4);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) != 0) {
    pcVar3 = GetMakefile(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"CMAKE_HOST_SYSTEM_NAME",&local_b1);
    psVar4 = cmMakefile::GetSafeDefinition(pcVar3,&local_b0);
    std::__cxx11::string::string((string *)local_90,(string *)psVar4);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_90,"Windows");
    if (bVar1) {
      std::__cxx11::string::operator=((string *)local_38,"windows+pe");
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_90,"Darwin");
      if (bVar1) {
        std::__cxx11::string::operator=((string *)local_38,"macos+macho");
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_90,"Linux");
        if (bVar1) {
          std::__cxx11::string::operator=((string *)local_38,"linux+elf");
        }
      }
    }
    std::__cxx11::string::~string((string *)local_90);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38,"linux+elf");
  if (bVar1) {
    local_c8 = this;
    std::make_unique<cmBinUtilsLinuxELFLinker,cmRuntimeDependencyArchive*>
              ((cmRuntimeDependencyArchive **)&local_c0);
    std::unique_ptr<cmBinUtilsLinker,std::default_delete<cmBinUtilsLinker>>::operator=
              ((unique_ptr<cmBinUtilsLinker,std::default_delete<cmBinUtilsLinker>> *)&this->Linker,
               &local_c0);
    std::unique_ptr<cmBinUtilsLinuxELFLinker,_std::default_delete<cmBinUtilsLinuxELFLinker>_>::
    ~unique_ptr(&local_c0);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_38,"windows+pe");
    if (bVar1) {
      local_d8 = this;
      std::make_unique<cmBinUtilsWindowsPELinker,cmRuntimeDependencyArchive*>
                ((cmRuntimeDependencyArchive **)&local_d0);
      std::unique_ptr<cmBinUtilsLinker,std::default_delete<cmBinUtilsLinker>>::operator=
                ((unique_ptr<cmBinUtilsLinker,std::default_delete<cmBinUtilsLinker>> *)&this->Linker
                 ,&local_d0);
      std::unique_ptr<cmBinUtilsWindowsPELinker,_std::default_delete<cmBinUtilsWindowsPELinker>_>::
      ~unique_ptr(&local_d0);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_38,"macos+macho");
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_260);
        poVar6 = std::operator<<((ostream *)local_260,
                                 "Invalid value for CMAKE_GET_RUNTIME_DEPENDENCIES_PLATFORM: ");
        std::operator<<(poVar6,(string *)local_38);
        std::__cxx11::ostringstream::str();
        SetError(this,&local_280);
        std::__cxx11::string::~string((string *)&local_280);
        this_local._7_1_ = false;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_260);
        goto LAB_00764584;
      }
      std::make_unique<cmBinUtilsMacOSMachOLinker,cmRuntimeDependencyArchive*>
                ((cmRuntimeDependencyArchive **)&local_e0);
      std::unique_ptr<cmBinUtilsLinker,std::default_delete<cmBinUtilsLinker>>::operator=
                ((unique_ptr<cmBinUtilsLinker,std::default_delete<cmBinUtilsLinker>> *)&this->Linker
                 ,&local_e0);
      std::unique_ptr<cmBinUtilsMacOSMachOLinker,_std::default_delete<cmBinUtilsMacOSMachOLinker>_>
      ::~unique_ptr(&local_e0);
    }
  }
  pcVar7 = std::unique_ptr<cmBinUtilsLinker,_std::default_delete<cmBinUtilsLinker>_>::operator->
                     (&this->Linker);
  iVar2 = (*pcVar7->_vptr_cmBinUtilsLinker[2])();
  this_local._7_1_ = (bool)((byte)iVar2 & 1);
LAB_00764584:
  std::__cxx11::string::~string((string *)local_38);
  return this_local._7_1_;
}

Assistant:

bool cmRuntimeDependencyArchive::Prepare()
{
  std::string platform = this->GetMakefile()->GetSafeDefinition(
    "CMAKE_GET_RUNTIME_DEPENDENCIES_PLATFORM");
  if (platform.empty()) {
    std::string systemName =
      this->GetMakefile()->GetSafeDefinition("CMAKE_HOST_SYSTEM_NAME");
    if (systemName == "Windows") {
      platform = "windows+pe";
    } else if (systemName == "Darwin") {
      platform = "macos+macho";
    } else if (systemName == "Linux") {
      platform = "linux+elf";
    }
  }
  if (platform == "linux+elf") {
    this->Linker = cm::make_unique<cmBinUtilsLinuxELFLinker>(this);
  } else if (platform == "windows+pe") {
    this->Linker = cm::make_unique<cmBinUtilsWindowsPELinker>(this);
  } else if (platform == "macos+macho") {
    this->Linker = cm::make_unique<cmBinUtilsMacOSMachOLinker>(this);
  } else {
    std::ostringstream e;
    e << "Invalid value for CMAKE_GET_RUNTIME_DEPENDENCIES_PLATFORM: "
      << platform;
    this->SetError(e.str());
    return false;
  }

  return this->Linker->Prepare();
}